

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int detectPresence(char *aExecutable)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  FILE *lIn;
  char lTestedString [1024];
  char lBuff [1024];
  char *aExecutable_local;
  
  memset(&lIn,0,0x400);
  lIn._0_1_ = 0x77;
  lIn._1_1_ = 0x68;
  lIn._2_1_ = 0x69;
  lIn._3_1_ = 99;
  lIn._4_1_ = 0x68;
  lIn._5_1_ = 0x20;
  strcat((char *)&lIn,aExecutable);
  strcat((char *)&lIn," 2>/dev/null ");
  __stream = popen((char *)&lIn,"r");
  pcVar2 = fgets(lTestedString + 0x3f8,0x400,__stream);
  if (((pcVar2 != (char *)0x0) &&
      (pcVar2 = strchr(lTestedString + 0x3f8,0x3a), pcVar2 == (char *)0x0)) &&
     (iVar1 = strncmp(lTestedString + 0x3f8,"no ",3), iVar1 != 0)) {
    pclose(__stream);
    if (tinyfd_verbose != 0) {
      printf("detectPresence %s %d\n",aExecutable,1);
    }
    return 1;
  }
  pclose(__stream);
  if (tinyfd_verbose != 0) {
    printf("detectPresence %s %d\n",aExecutable,0);
  }
  return 0;
}

Assistant:

static int detectPresence( char const * const aExecutable )
{
        char lBuff [MAX_PATH_OR_CMD] ;
        char lTestedString [MAX_PATH_OR_CMD] = "which " ;
        FILE * lIn ;

    strcat( lTestedString , aExecutable ) ;
        strcat( lTestedString, " 2>/dev/null ");
    lIn = popen( lTestedString , "r" ) ;
    if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                && ( ! strchr( lBuff , ':' ) )
                && ( strncmp(lBuff, "no ", 3) ) )
    {   /* present */
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 1);
        return 1 ;
    }
    else
    {
        pclose( lIn ) ;
        if (tinyfd_verbose) printf("detectPresence %s %d\n", aExecutable, 0);
        return 0 ;
    }
}